

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O1

qpdf_offset_t __thiscall QPDFXRefEntry::getOffset(QPDFXRefEntry *this)

{
  logic_error *this_00;
  
  if (this->type == 1) {
    return this->field1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"getOffset called for xref entry of type != 1");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

qpdf_offset_t
QPDFXRefEntry::getOffset() const
{
    if (this->type != 1) {
        throw std::logic_error("getOffset called for xref entry of type != 1");
    }
    return this->field1;
}